

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric_stats.cpp
# Opt level: O3

bool duckdb::NumericStats::IsConstant(BaseStatistics *stats)

{
  bool bVar1;
  Value VStack_88;
  Value local_48;
  
  Max(&local_48,stats);
  Min(&VStack_88,stats);
  bVar1 = Value::operator<=(&local_48,&VStack_88);
  Value::~Value(&VStack_88);
  Value::~Value(&local_48);
  return bVar1;
}

Assistant:

bool NumericStats::IsConstant(const BaseStatistics &stats) {
	return NumericStats::Max(stats) <= NumericStats::Min(stats);
}